

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
                 *this,ostream *os)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Type TVar4;
  ostream *poVar5;
  int *piVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  ostream *in_RSI;
  Name *in_RDI;
  ostream *unaff_retaddr;
  size_t in_stack_00000008;
  SingleAttribute<avro::Name> *in_stack_00000010;
  int i;
  int count;
  undefined8 in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  int local_18;
  Name *n;
  
  TVar4 = (Type)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  n = in_RDI;
  Node::type((Node *)in_RDI);
  avro::operator<<(in_stack_ffffffffffffffc0,TVar4);
  uVar2 = (*(*(_func_int ***)&in_RDI->ns_)[2])();
  if ((uVar2 & 1) != 0) {
    std::operator<<(in_RSI,' ');
    concepts::SingleAttribute<avro::Name>::get(in_stack_00000010,in_stack_00000008);
    avro::operator<<(unaff_retaddr,n);
  }
  poVar5 = std::operator<<(in_RSI," ");
  piVar6 = concepts::SingleAttribute<int>::get
                     ((SingleAttribute<int> *)in_stack_00000010,in_stack_00000008);
  std::ostream::operator<<(poVar5,*piVar6);
  std::operator<<(in_RSI,'\n');
  iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[4])();
  if (iVar3 == 0) {
    iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[7])();
    poVar5 = (ostream *)CONCAT44(extraout_var,iVar3);
  }
  else {
    poVar5 = (ostream *)(long)iVar3;
  }
  iVar3 = (int)poVar5;
  for (local_18 = 0; local_18 < iVar3; local_18 = local_18 + 1) {
    Node::type((Node *)in_RDI);
  }
  TVar4 = Node::type((Node *)in_RDI);
  bVar1 = isCompound(TVar4);
  if (bVar1) {
    poVar7 = std::operator<<(in_RSI,"end ");
    TVar4 = (Type)((ulong)poVar7 >> 0x20);
    Node::type((Node *)in_RDI);
    poVar5 = avro::operator<<(poVar5,TVar4);
    std::operator<<(poVar5,'\n');
  }
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}